

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

void __thiscall cmDependsC::ReadCacheFile(cmDependsC *this)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  string_view sVar5;
  bool local_312;
  undefined1 local_2f8 [8];
  UnscannedEntry entry;
  bool newer;
  bool res;
  cmFileTime fileTime;
  bool cacheFileTimeGood;
  cmFileTime cacheFileTime;
  mapped_type *pmStack_250;
  bool haveFileName;
  cmIncludeLines *cacheEntry;
  string line;
  long local_218;
  ifstream fin;
  cmDependsC *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_218,pcVar4,_S_in);
    bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::string((string *)&cacheEntry);
      pmStack_250 = (mapped_type *)0x0;
      cacheFileTime.Time._7_1_ = 0;
      cmFileTime::cmFileTime((cmFileTime *)&stack0xfffffffffffffda0);
      fileTime.Time._7_1_ =
           cmFileTime::Load((cmFileTime *)&stack0xfffffffffffffda0,&this->CacheFileName);
      do {
        while( true ) {
          do {
            while( true ) {
              while( true ) {
                while( true ) {
                  bVar2 = cmsys::SystemTools::GetLineFromStream
                                    ((istream *)&local_218,(string *)&cacheEntry,(bool *)0x0,
                                     0xffffffffffffffff);
                  if (!bVar2) {
                    line.field_2._8_4_ = 0;
                    goto LAB_00963b35;
                  }
                  uVar3 = std::__cxx11::string::empty();
                  if ((uVar3 & 1) == 0) break;
                  pmStack_250 = (mapped_type *)0x0;
                  cacheFileTime.Time._7_1_ = 0;
                }
                if ((cacheFileTime.Time._7_1_ & 1) == 0) break;
                if (pmStack_250 != (mapped_type *)0x0) {
                  UnscannedEntry::UnscannedEntry((UnscannedEntry *)local_2f8);
                  std::__cxx11::string::operator=((string *)local_2f8,(string *)&cacheEntry);
                  bVar2 = cmsys::SystemTools::GetLineFromStream
                                    ((istream *)&local_218,(string *)&cacheEntry,(bool *)0x0,
                                     0xffffffffffffffff);
                  if (bVar2) {
                    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&cacheEntry,"-");
                    if (bVar2) {
                      std::__cxx11::string::operator=
                                ((string *)(entry.FileName.field_2._M_local_buf + 8),
                                 (string *)&cacheEntry);
                    }
                    std::
                    vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
                    ::push_back(&pmStack_250->UnscannedEntries,(value_type *)local_2f8);
                  }
                  UnscannedEntry::~UnscannedEntry((UnscannedEntry *)local_2f8);
                }
              }
              cacheFileTime.Time._7_1_ = 1;
              cmFileTime::cmFileTime((cmFileTime *)&stack0xfffffffffffffd90);
              local_312 = false;
              if ((fileTime.Time._7_1_ & 1) != 0) {
                local_312 = cmFileTime::Load((cmFileTime *)&stack0xfffffffffffffd90,
                                             (string *)&cacheEntry);
              }
              if ((local_312 == false) ||
                 (bVar2 = cmFileTime::Newer((cmFileTime *)&stack0xfffffffffffffda0,
                                            (cmFileTime *)&stack0xfffffffffffffd90), !bVar2)) break;
              pmStack_250 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
                            ::operator[](&this->FileCache,(key_type *)&cacheEntry);
            }
          } while (local_312 != false);
          sVar5 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&cacheEntry);
          bVar2 = cmHasLiteralPrefix<20ul>(sVar5,(char (*) [20])"#IncludeRegexLine: ");
          if (bVar2) break;
          sVar5 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&cacheEntry);
          bVar2 = cmHasLiteralPrefix<20ul>(sVar5,(char (*) [20])"#IncludeRegexScan: ");
          if (bVar2) {
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&cacheEntry,&this->IncludeRegexScanString);
            if (bVar2) {
              line.field_2._8_4_ = 1;
              goto LAB_00963b35;
            }
          }
          else {
            sVar5 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&cacheEntry);
            bVar2 = cmHasLiteralPrefix<24ul>(sVar5,(char (*) [24])"#IncludeRegexComplain: ");
            if (bVar2) {
              bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&cacheEntry,&this->IncludeRegexComplainString);
              if (bVar2) {
                line.field_2._8_4_ = 1;
                goto LAB_00963b35;
              }
            }
            else {
              sVar5 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&cacheEntry);
              entry.QuotedLocation.field_2._8_8_ = sVar5._M_len;
              bVar2 = cmHasLiteralPrefix<25ul>(sVar5,(char (*) [25])"#IncludeRegexTransform: ");
              if ((bVar2) &&
                 (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&cacheEntry,&this->IncludeRegexTransformString), bVar2)
                 ) {
                line.field_2._8_4_ = 1;
                goto LAB_00963b35;
              }
            }
          }
        }
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cacheEntry,&this->IncludeRegexLineString);
      } while (!bVar2);
      line.field_2._8_4_ = 1;
LAB_00963b35:
      std::__cxx11::string::~string((string *)&cacheEntry);
    }
    else {
      line.field_2._8_4_ = 1;
    }
    std::ifstream::~ifstream(&local_218);
  }
  return;
}

Assistant:

void cmDependsC::ReadCacheFile()
{
  if (this->CacheFileName.empty()) {
    return;
  }
  cmsys::ifstream fin(this->CacheFileName.c_str());
  if (!fin) {
    return;
  }

  std::string line;
  cmIncludeLines* cacheEntry = nullptr;
  bool haveFileName = false;

  cmFileTime cacheFileTime;
  bool const cacheFileTimeGood = cacheFileTime.Load(this->CacheFileName);
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (line.empty()) {
      cacheEntry = nullptr;
      haveFileName = false;
      continue;
    }
    // the first line after an empty line is the name of the parsed file
    if (!haveFileName) {
      haveFileName = true;

      cmFileTime fileTime;
      bool const res = cacheFileTimeGood && fileTime.Load(line);
      bool const newer = res && cacheFileTime.Newer(fileTime);

      if (res && newer) // cache is newer than the parsed file
      {
        cacheEntry = &this->FileCache[line];
      }
      // file doesn't exist, check that the regular expressions
      // haven't changed
      else if (!res) {
        if (cmHasLiteralPrefix(line, INCLUDE_REGEX_LINE_MARKER)) {
          if (line != this->IncludeRegexLineString) {
            return;
          }
        } else if (cmHasLiteralPrefix(line, INCLUDE_REGEX_SCAN_MARKER)) {
          if (line != this->IncludeRegexScanString) {
            return;
          }
        } else if (cmHasLiteralPrefix(line, INCLUDE_REGEX_COMPLAIN_MARKER)) {
          if (line != this->IncludeRegexComplainString) {
            return;
          }
        } else if (cmHasLiteralPrefix(line, INCLUDE_REGEX_TRANSFORM_MARKER)) {
          if (line != this->IncludeRegexTransformString) {
            return;
          }
        }
      }
    } else if (cacheEntry != nullptr) {
      UnscannedEntry entry;
      entry.FileName = line;
      if (cmSystemTools::GetLineFromStream(fin, line)) {
        if (line != "-") {
          entry.QuotedLocation = line;
        }
        cacheEntry->UnscannedEntries.push_back(std::move(entry));
      }
    }
  }
}